

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkIvyStrash(Abc_Ntk_t *pNtk)

{
  Ivy_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  
  pMan = Abc_NtkIvyBefore(pNtk,1,0);
  if (pMan == (Ivy_Man_t *)0x0) {
    pAVar1 = (Abc_Ntk_t *)0x0;
  }
  else {
    pAVar1 = Abc_NtkIvyAfter(pNtk,pMan,1,0);
    Ivy_ManStop(pMan);
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyStrash( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkAig;
    Ivy_Man_t * pMan;
    pMan = Abc_NtkIvyBefore( pNtk, 1, 0 );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 1, 0 );
    Ivy_ManStop( pMan );
    return pNtkAig;
}